

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExtract.c
# Opt level: O1

void Abc_NtkTraverseSupersXor_rec(Abc_ShaMan_t *p,Abc_Obj_t *pObj,Vec_Ptr_t *vInputs)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Ntk_t *pAVar3;
  word *pwVar4;
  uint uVar5;
  int iVar6;
  Vec_Wrd_t *__ptr;
  Vec_Int_t *p_00;
  int *piVar7;
  int Fill;
  Vec_Ptr_t *pVVar8;
  Vec_Ptr_t *extraout_RDX;
  uint uVar9;
  long lVar10;
  long lVar11;
  uint local_4c;
  Vec_Wrd_t *local_48;
  Vec_Ptr_t *local_40;
  word *local_38;
  
  pVVar8 = vInputs;
  while( true ) {
    pAVar2 = pObj->pNtk;
    iVar6 = pObj->Id;
    Vec_IntFillExtra(&pAVar2->vTravIds,iVar6 + 1,(int)pVVar8);
    if (((long)iVar6 < 0) || ((pAVar2->vTravIds).nSize <= iVar6)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    pAVar3 = pObj->pNtk;
    iVar1 = pAVar3->nTravIds;
    if ((pAVar2->vTravIds).pArray[iVar6] == iVar1) {
      return;
    }
    iVar6 = pObj->Id;
    Vec_IntFillExtra(&pAVar3->vTravIds,iVar6 + 1,Fill);
    if (((long)iVar6 < 0) || ((pAVar3->vTravIds).nSize <= iVar6)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    (pAVar3->vTravIds).pArray[iVar6] = iVar1;
    uVar5 = *(uint *)&pObj->field_0x14 & 0xf;
    if (uVar5 != 7) {
      if (uVar5 == 2) {
        return;
      }
      if (uVar5 == 5) {
        return;
      }
      __assert_fail("Abc_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcExtract.c"
                    ,0xf4,
                    "void Abc_NtkTraverseSupersXor_rec(Abc_ShaMan_t *, Abc_Obj_t *, Vec_Ptr_t *)");
    }
    iVar6 = Abc_NodeIsExorType(pObj);
    if (iVar6 != 0) break;
    Abc_NtkTraverseSupersXor_rec
              (p,(Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray],vInputs);
    pObj = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[1]];
    pVVar8 = extraout_RDX;
  }
  __ptr = Abc_NtkShareSuperXor(pObj,(int *)&local_4c,&p->nFoundGates);
  iVar6 = __ptr->nSize;
  lVar10 = (long)iVar6;
  if ((lVar10 < 2) || (p->nMultiSize <= iVar6)) {
    local_48 = __ptr;
    if (0 < iVar6) {
      local_38 = __ptr->pArray;
      lVar11 = 0;
      local_40 = vInputs;
      do {
        uVar5 = (uint)local_38[lVar11];
        if (((int)uVar5 < 0) || (local_40->nSize <= (int)uVar5)) goto LAB_00260454;
        uVar9 = uVar5 & 0x7fffffff;
        p_00 = (Vec_Int_t *)local_40->pArray[uVar9];
        if (p_00 == (Vec_Int_t *)0x0) {
          p_00 = (Vec_Int_t *)malloc(0x10);
          p_00->nCap = 0x10;
          p_00->nSize = 0;
          piVar7 = (int *)malloc(0x40);
          p_00->pArray = piVar7;
          Vec_IntPush(p_00,uVar5 * 2);
          pVVar8 = p->pNtk->vObjs;
          if (pVVar8->nSize <= (int)uVar5) goto LAB_00260454;
          Vec_IntPush(p_00,*(uint *)((long)pVVar8->pArray[uVar9] + 0x14) >> 0xc);
          if (p_00->nSize != 2) {
            __assert_fail("SHARE_NUM == Vec_IntSize(vInput)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcExtract.c"
                          ,0x105,
                          "void Abc_NtkTraverseSupersXor_rec(Abc_ShaMan_t *, Abc_Obj_t *, Vec_Ptr_t *)"
                         );
          }
          if (local_40->nSize <= (int)uVar5) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                          ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
          }
          local_40->pArray[uVar9] = p_00;
        }
        Vec_IntPush(p_00,p->vObj2Lit->nSize);
        lVar11 = lVar11 + 1;
        vInputs = local_40;
      } while (lVar10 != lVar11);
    }
    if ((pObj->Id < 0) || (1 < local_4c)) {
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                    ,0xf1,"int Abc_Var2Lit(int, int)");
    }
    Vec_IntPush(p->vObj2Lit,local_4c + pObj->Id * 2);
    __ptr = local_48;
  }
  if (0 < iVar6) {
    pwVar4 = __ptr->pArray;
    lVar11 = 0;
    do {
      uVar5 = (uint)pwVar4[lVar11];
      if (((int)uVar5 < 0) || (pVVar8 = p->pNtk->vObjs, pVVar8->nSize <= (int)uVar5)) {
LAB_00260454:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Abc_NtkTraverseSupersXor_rec(p,(Abc_Obj_t *)pVVar8->pArray[uVar5 & 0x7fffffff],vInputs);
      lVar11 = lVar11 + 1;
    } while (lVar10 != lVar11);
  }
  if (__ptr->pArray != (word *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (word *)0x0;
  }
  if (__ptr != (Vec_Wrd_t *)0x0) {
    free(__ptr);
  }
  return;
}

Assistant:

void Abc_NtkTraverseSupersXor_rec( Abc_ShaMan_t * p, Abc_Obj_t * pObj, Vec_Ptr_t * vInputs )
{
    if ( Abc_NodeIsTravIdCurrent( pObj ) )
        return;
    Abc_NodeSetTravIdCurrent( pObj );
    if ( Abc_ObjIsCi(pObj) )
        return;
    assert( Abc_ObjIsNode(pObj) );
    if ( Abc_NodeIsExorType(pObj) )
    {
        Vec_Wrd_t * vSuper;
        int k, fCompl;
        word Num;
        vSuper = Abc_NtkShareSuperXor( pObj, &fCompl, &p->nFoundGates );
        if ( Vec_WrdSize(vSuper) <= 1 || Vec_WrdSize(vSuper) >= p->nMultiSize )
        {
            Vec_WrdForEachEntry( vSuper, Num, k )
            {
                Vec_Int_t * vInput = (Vec_Int_t *)Vec_PtrEntry( vInputs, (int)Num );
                if ( vInput == NULL )
                {
                    vInput = Vec_IntAlloc( 10 );
                    Vec_IntPush( vInput, Abc_Var2Lit((int)Num, 0) );
                    Vec_IntPush( vInput, Abc_ObjLevel(Abc_NtkObj(p->pNtk, (int)Num)) );
                    assert( SHARE_NUM == Vec_IntSize(vInput) );
                    Vec_PtrWriteEntry( vInputs, (int)Num, vInput );
                }
                Vec_IntPush( vInput, Vec_IntSize(p->vObj2Lit) );
            }
            Vec_IntPush( p->vObj2Lit, Abc_Var2Lit(Abc_ObjId(pObj), fCompl) );
        }
        // call recursively
        Vec_WrdForEachEntry( vSuper, Num, k )
            Abc_NtkTraverseSupersXor_rec( p, Abc_NtkObj(p->pNtk, (int)Num), vInputs );
        Vec_WrdFree( vSuper );
    }
    else
    {
        Abc_NtkTraverseSupersXor_rec( p, Abc_ObjFanin0(pObj), vInputs );
        Abc_NtkTraverseSupersXor_rec( p, Abc_ObjFanin1(pObj), vInputs );
    }
}